

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerHLSL::analyze_meshlet_writes
          (CompilerHLSL *this,uint32_t func_id,uint32_t id_per_vertex,uint32_t id_per_primitive,
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *processed_func_ids)

{
  ID *pIVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  bool bVar4;
  uint32_t uVar5;
  iterator iVar6;
  SPIRFunction *pSVar7;
  SPIRBlock *pSVar8;
  uint32_t *puVar9;
  SPIRVariable *var;
  long lVar10;
  SPIRFunction *pSVar11;
  Parameter *pPVar12;
  Parameter *pPVar13;
  uint uVar14;
  uint32_t uVar15;
  Parameter *iarg;
  Instruction *i;
  Instruction *instr;
  Instruction *pIVar16;
  Parameter *pPVar17;
  Parameter local_6c;
  SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL> *__range5;
  uint32_t func_id_local;
  _Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_48;
  TypedID<(spirv_cross::Types)6> *local_40;
  TypedID<(spirv_cross::Types)6> *local_38;
  
  func_id_local = func_id;
  local_48 = (_Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              *)processed_func_ids;
  iVar6 = ::std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::find(&processed_func_ids->_M_h,&func_id_local);
  if (iVar6.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
    ::std::__detail::
    _Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::insert(local_48,&func_id_local);
    pSVar7 = Compiler::get<spirv_cross::SPIRFunction>((Compiler *)this,func_id_local);
    local_38 = (pSVar7->blocks).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)6>_>.ptr;
    local_40 = local_38 +
               (pSVar7->blocks).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)6>_>.
               buffer_size;
    __range5 = &pSVar7->arguments;
    for (; local_38 != local_40; local_38 = local_38 + 1) {
      pSVar8 = Compiler::get<spirv_cross::SPIRBlock>((Compiler *)this,local_38->id);
      instr = (pSVar8->ops).super_VectorView<spirv_cross::Instruction>.ptr;
      pIVar16 = instr + (pSVar8->ops).super_VectorView<spirv_cross::Instruction>.buffer_size;
      for (; instr != pIVar16; instr = instr + 1) {
        puVar9 = Compiler::stream((Compiler *)this,instr);
        uVar14 = instr->op - 0x39;
        if (uVar14 < 0xe) {
          if ((0x2f30U >> (uVar14 & 0x1f) & 1) == 0) {
            if (uVar14 == 0) {
              uVar15 = puVar9[2];
              analyze_meshlet_writes
                        (this,uVar15,id_per_vertex,id_per_primitive,
                         (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                          *)local_48);
              pSVar11 = Compiler::get<spirv_cross::SPIRFunction>((Compiler *)this,uVar15);
              pPVar13 = (pSVar11->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.
                        ptr;
              pPVar17 = pPVar13 + (pSVar11->arguments).
                                  super_VectorView<spirv_cross::SPIRFunction::Parameter>.buffer_size
              ;
              for (; pPVar13 != pPVar17; pPVar13 = pPVar13 + 1) {
                if (pPVar13->alias_global_variable == true) {
                  pPVar12 = (pSVar7->arguments).
                            super_VectorView<spirv_cross::SPIRFunction::Parameter>.ptr;
                  lVar10 = (pSVar7->arguments).
                           super_VectorView<spirv_cross::SPIRFunction::Parameter>.buffer_size * 0x14
                  ;
                  do {
                    if (lVar10 == 0) {
                      local_6c.type.id =
                           Compiler::expression_type_id((Compiler *)this,(pPVar13->id).id);
                      uVar2 = pPVar13->id;
                      uVar3 = pPVar13->read_count;
                      local_6c.write_count = pPVar13->write_count;
                      local_6c.alias_global_variable = true;
                      local_6c.id.id = uVar2;
                      local_6c.read_count = uVar3;
                      SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL>::push_back
                                (__range5,&local_6c);
                      break;
                    }
                    pIVar1 = &pPVar12->id;
                    pPVar12 = pPVar12 + 1;
                    lVar10 = lVar10 + -0x14;
                  } while (pIVar1->id != (pPVar13->id).id);
                }
              }
            }
          }
          else {
            var = Compiler::maybe_get<spirv_cross::SPIRVariable>
                            ((Compiler *)this,puVar9[(ulong)(instr->op != 0x3e) * 2]);
            if ((var != (SPIRVariable *)0x0) &&
               ((var->storage == StorageClassTaskPayloadWorkgroupEXT || (var->storage == Output))))
            {
              uVar5 = Compiler::get_decoration
                                ((Compiler *)this,(ID)(var->super_IVariant).self.id,BuiltIn);
              uVar15 = (var->super_IVariant).self.id;
              if ((uVar5 - 0x14b1 < 0xfffffffd) &&
                 ((var->storage != StorageClassTaskPayloadWorkgroupEXT &&
                  (bVar4 = CompilerGLSL::is_per_primitive_variable(&this->super_CompilerGLSL,var),
                  uVar15 = id_per_vertex, bVar4)))) {
                uVar15 = id_per_primitive;
              }
              lVar10 = (pSVar7->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.
                       buffer_size * 0x14;
              pPVar13 = (pSVar7->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.
                        ptr;
              do {
                if (lVar10 == 0) {
                  local_6c.type.id = Compiler::expression_type_id((Compiler *)this,uVar15);
                  local_6c.write_count =
                       (uint32_t)(var->storage != StorageClassTaskPayloadWorkgroupEXT);
                  local_6c.read_count = 1;
                  local_6c.alias_global_variable = true;
                  local_6c.id.id = uVar15;
                  SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL>::push_back
                            (__range5,&local_6c);
                  break;
                }
                lVar10 = lVar10 + -0x14;
                pIVar1 = &pPVar13->id;
                pPVar13 = pPVar13 + 1;
              } while (pIVar1->id != uVar15);
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void CompilerHLSL::analyze_meshlet_writes(uint32_t func_id, uint32_t id_per_vertex, uint32_t id_per_primitive,
                                          std::unordered_set<uint32_t> &processed_func_ids)
{
	// Avoid processing a function more than once
	if (processed_func_ids.find(func_id) != processed_func_ids.end())
		return;
	processed_func_ids.insert(func_id);

	auto &func = get<SPIRFunction>(func_id);
	// Recursively establish global args added to functions on which we depend.
	for (auto& block : func.blocks)
	{
		auto &b = get<SPIRBlock>(block);
		for (auto &i : b.ops)
		{
			auto ops = stream(i);
			auto op = static_cast<Op>(i.op);

			switch (op)
			{
			case OpFunctionCall:
			{
				// Then recurse into the function itself to extract globals used internally in the function
				uint32_t inner_func_id = ops[2];
				analyze_meshlet_writes(inner_func_id, id_per_vertex, id_per_primitive, processed_func_ids);
				auto &inner_func = get<SPIRFunction>(inner_func_id);
				for (auto &iarg : inner_func.arguments)
				{
					if (!iarg.alias_global_variable)
						continue;

					bool already_declared = false;
					for (auto &arg : func.arguments)
					{
						if (arg.id == iarg.id)
						{
							already_declared = true;
							break;
						}
					}

					if (!already_declared)
					{
						// basetype is effectively ignored here since we declare the argument
						// with explicit types. Just pass down a valid type.
						func.arguments.push_back({ expression_type_id(iarg.id), iarg.id,
						                           iarg.read_count, iarg.write_count, true });
					}
				}
				break;
			}

			case OpStore:
			case OpLoad:
			case OpInBoundsAccessChain:
			case OpAccessChain:
			case OpPtrAccessChain:
			case OpInBoundsPtrAccessChain:
			case OpArrayLength:
			{
				auto *var = maybe_get<SPIRVariable>(ops[op == OpStore ? 0 : 2]);
				if (var && (var->storage == StorageClassOutput || var->storage == StorageClassTaskPayloadWorkgroupEXT))
				{
					bool already_declared = false;
					auto builtin_type = BuiltIn(get_decoration(var->self, DecorationBuiltIn));

					uint32_t var_id = var->self;
					if (var->storage != StorageClassTaskPayloadWorkgroupEXT &&
						builtin_type != BuiltInPrimitivePointIndicesEXT &&
						builtin_type != BuiltInPrimitiveLineIndicesEXT &&
						builtin_type != BuiltInPrimitiveTriangleIndicesEXT)
					{
						var_id = is_per_primitive_variable(*var) ? id_per_primitive : id_per_vertex;
					}

					for (auto &arg : func.arguments)
					{
						if (arg.id == var_id)
						{
							already_declared = true;
							break;
						}
					}

					if (!already_declared)
					{
						// basetype is effectively ignored here since we declare the argument
						// with explicit types. Just pass down a valid type.
						uint32_t type_id = expression_type_id(var_id);
						if (var->storage == StorageClassTaskPayloadWorkgroupEXT)
							func.arguments.push_back({ type_id, var_id, 1u, 0u, true });
						else
							func.arguments.push_back({ type_id, var_id, 1u, 1u, true });
					}
				}
				break;
			}

			default:
				break;
			}
		}
	}
}